

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::brokerRegistration(CoreBroker *this,ActionMessage *command)

{
  string_view name;
  string_view name_00;
  string_view searchValue;
  string_view name_01;
  format_args args;
  string_view message;
  bool bVar1;
  uint uVar2;
  route_id rVar3;
  uint uVar4;
  __int_type _Var5;
  BaseType BVar6;
  pointer pBVar7;
  pointer pBVar8;
  mapped_type *pmVar9;
  size_type sVar10;
  BasicBrokerInfo *pBVar11;
  ActionMessage *in_RSI;
  CoreBroker *in_RDI;
  string_view sVar12;
  ActionMessage brokerReply_1;
  route_id route;
  GlobalBrokerId global_brkid;
  optional<unsigned_long> inserted;
  ActionMessage testInit;
  bool route_created;
  route_id newroute;
  ActionMessage noInit;
  BrokerState currentBrokerState;
  ActionMessage brokerReply;
  __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
  brk;
  bool jsonReply;
  undefined4 in_stack_fffffffffffff968;
  int32_t in_stack_fffffffffffff96c;
  int32_t in_stack_fffffffffffff970;
  int in_stack_fffffffffffff974;
  ActionMessage *in_stack_fffffffffffff978;
  undefined4 in_stack_fffffffffffff980;
  undefined4 in_stack_fffffffffffff984;
  CoreBroker *in_stack_fffffffffffff988;
  action_t aVar13;
  GlobalFederateId in_stack_fffffffffffff990;
  undefined4 in_stack_fffffffffffff994;
  CoreBroker *in_stack_fffffffffffff998;
  GlobalBrokerId *in_stack_fffffffffffff9a0;
  ActionMessage *in_stack_fffffffffffff9a8;
  SimpleQueue<helics::ActionMessage,_std::mutex> *in_stack_fffffffffffff9b0;
  BaseType local_5b0;
  BaseType local_5ac;
  string_view local_5a8;
  char *local_598;
  undefined8 local_590;
  undefined1 local_588 [32];
  __sv_type local_568;
  __sv_type local_558;
  BaseType local_544;
  GlobalFederateId local_540;
  int32_t in_stack_fffffffffffffac4;
  ActionMessage *in_stack_fffffffffffffac8;
  CoreBroker *in_stack_fffffffffffffad0;
  undefined1 auVar14 [13];
  GlobalBrokerId GVar15;
  GlobalFederateId in_stack_fffffffffffffadc;
  GlobalBrokerId id;
  GlobalFederateId in_stack_fffffffffffffae4;
  undefined1 local_518 [4];
  GlobalFederateId in_stack_fffffffffffffaec;
  route_id local_44c;
  GlobalBrokerId local_448;
  GlobalBrokerId local_444;
  undefined4 local_440;
  BaseType local_43c;
  GlobalFederateId local_438;
  undefined4 local_434;
  GlobalBrokerId in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  BaseType in_stack_fffffffffffffbd8;
  route_id in_stack_fffffffffffffbdc;
  __sv_type in_stack_fffffffffffffbe0;
  string_view local_400;
  size_t in_stack_fffffffffffffc10;
  char *pcVar16;
  char *local_3e0;
  GlobalFederateId local_3ac;
  ActionMessage local_3a8;
  BaseType local_2f0;
  BaseType local_2ec;
  __sv_type local_2e8;
  uint local_2d8;
  BaseType local_2d4;
  undefined4 local_2d0;
  byte local_2c9;
  route_id local_2c8;
  undefined4 local_2c4;
  BaseType local_2c0;
  GlobalFederateId local_2bc;
  undefined1 local_2b8 [8];
  BaseType local_2b0;
  BrokerState local_1fa;
  uint local_1f8;
  string_view local_1e8;
  BaseType local_1d8;
  GlobalFederateId local_1d4;
  BaseType local_1d0;
  GlobalFederateId local_1cc;
  ActionMessage local_1c8;
  BaseType local_110;
  GlobalFederateId local_10c;
  __sv_type local_108;
  uint local_f8;
  BaseType local_f4;
  BasicBrokerInfo *local_f0;
  string_view local_e8;
  __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
  local_d8;
  undefined1 local_c9;
  ActionMessage *local_c8;
  undefined1 local_b8 [16];
  BaseType local_a8 [4];
  BaseType local_98 [4];
  undefined8 local_88;
  undefined1 *local_80;
  char *local_78;
  undefined8 uStack_70;
  BaseType *local_60;
  BaseType *local_58;
  string_view *local_50;
  char *local_48;
  undefined8 uStack_40;
  undefined1 *local_38;
  BaseType local_2c;
  BaseType *local_28;
  BaseType local_1c;
  BaseType *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  if (((in_RDI->super_BrokerBase).field_0x295 & 1) == 0) {
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
              ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
               CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
               (value_type *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
    return;
  }
  local_c8 = in_RSI;
  local_c9 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                       (in_RSI,use_json_serialization_flag);
  if (local_c8->counter != 0) {
    local_e8 = ActionMessage::name((ActionMessage *)0x5d9594);
    searchValue._M_len._4_4_ = in_stack_fffffffffffff994;
    searchValue._M_len._0_4_ = in_stack_fffffffffffff990.gid;
    searchValue._M_str = (char *)in_stack_fffffffffffff998;
    local_d8 = gmlc::containers::
               DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
               ::find((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                       *)in_stack_fffffffffffff988,searchValue);
    local_f0 = (BasicBrokerInfo *)
               gmlc::containers::
               DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
               ::end((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                      *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
    bVar1 = __gnu_cxx::
            operator==<helics::BasicBrokerInfo_*,_const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                      ((__normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                        *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                       (__normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                        *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      in_RDI->routeCount = in_RDI->routeCount + 1;
      local_f4 = (BaseType)generateRouteId(in_stack_fffffffffffff970,in_stack_fffffffffffff96c);
      aVar13 = (action_t)((ulong)in_stack_fffffffffffff988 >> 0x20);
      pBVar7 = __gnu_cxx::
               __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
               ::operator->(&local_d8);
      (pBVar7->route).rid = local_f4;
      pBVar7 = __gnu_cxx::
               __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
               ::operator->(&local_d8);
      local_f8 = (pBVar7->route).rid;
      uVar2 = ActionMessage::getExtraData((ActionMessage *)0x5d9687);
      ActionMessage::getString_abi_cxx11_(in_stack_fffffffffffff978,in_stack_fffffffffffff974);
      local_108 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
      (*(in_RDI->super_Broker)._vptr_Broker[0x24])
                (in_RDI,(ulong)local_f8,(ulong)uVar2,local_108._M_len,local_108._M_str);
      pBVar7 = __gnu_cxx::
               __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
               ::operator->(&local_d8);
      pBVar8 = __gnu_cxx::
               __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
               ::operator->(&local_d8);
      local_110 = (pBVar8->global_id).gid;
      GlobalFederateId::GlobalFederateId(&local_10c,(GlobalBrokerId)local_110);
      pmVar9 = CLI::std::
               unordered_map<helics::GlobalFederateId,_helics::route_id,_std::hash<helics::GlobalFederateId>,_std::equal_to<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>_>
               ::operator[]((unordered_map<helics::GlobalFederateId,_helics::route_id,_std::hash<helics::GlobalFederateId>,_std::equal_to<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>_>
                             *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                            (key_type *)
                            CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
      pmVar9->rid = (pBVar7->route).rid;
      ActionMessage::ActionMessage
                ((ActionMessage *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990.gid),
                 aVar13);
      local_1d0 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
      GlobalFederateId::GlobalFederateId(&local_1cc,(GlobalBrokerId)local_1d0);
      local_1c8.source_id.gid = local_1cc.gid;
      pBVar7 = __gnu_cxx::
               __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
               ::operator->(&local_d8);
      local_1d8 = (pBVar7->global_id).gid;
      GlobalFederateId::GlobalFederateId(&local_1d4,(GlobalBrokerId)local_1d8);
      local_1c8.dest_id.gid = local_1d4.gid;
      local_1e8 = ActionMessage::name((ActionMessage *)0x5d9801);
      sVar12._M_len._4_4_ = in_stack_fffffffffffff96c;
      sVar12._M_len._0_4_ = in_stack_fffffffffffff968;
      sVar12._M_str._0_4_ = in_stack_fffffffffffff970;
      sVar12._M_str._4_4_ = in_stack_fffffffffffff974;
      ActionMessage::name((ActionMessage *)0x5d9850,sVar12);
      if (((in_RDI->super_BrokerBase).no_ping & 1U) != 0) {
        setActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                  (&local_1c8,slow_responding_flag);
      }
      if ((((in_RDI->super_BrokerBase).globalTime & 1U) != 0) ||
         (((in_RDI->super_BrokerBase).asyncTime & 1U) != 0)) {
        setActionFlag<helics::ActionMessage,helics::ConnectionFlags>(&local_1c8,global_timing_flag);
        if (((in_RDI->super_BrokerBase).asyncTime & 1U) != 0) {
          setActionFlag<helics::ActionMessage,helics::ConnectionFlags>(&local_1c8,async_timing_flag)
          ;
        }
      }
      pBVar7 = __gnu_cxx::
               __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
               ::operator->(&local_d8);
      local_1f8 = (pBVar7->route).rid;
      (*(in_RDI->super_Broker)._vptr_Broker[0x22])(in_RDI,(ulong)local_1f8,&local_1c8);
      ActionMessage::~ActionMessage
                ((ActionMessage *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
      return;
    }
  }
  sVar10 = gmlc::containers::
           DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
           ::size((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                   *)0x5d9962);
  if ((in_RDI->super_BrokerBase).maxBrokerCount <= (int)sVar10) {
    sendBrokerErrorAck(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac4
                      );
    return;
  }
  local_1fa = BrokerBase::getBrokerState((BrokerBase *)0x5d999f);
  if (local_1fa < OPERATING) {
    bVar1 = allInitReady(in_stack_fffffffffffff998);
    if (bVar1) {
      ActionMessage::ActionMessage
                ((ActionMessage *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990.gid),
                 (action_t)((ulong)in_stack_fffffffffffff988 >> 0x20));
      local_2c0 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
      GlobalFederateId::GlobalFederateId(&local_2bc,(GlobalBrokerId)local_2c0);
      local_2b0 = local_2bc.gid;
      local_2c4 = 0;
      (*(in_RDI->super_Broker)._vptr_Broker[0x22])(in_RDI,0,local_2b8);
      ActionMessage::~ActionMessage
                ((ActionMessage *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
    }
  }
  else {
    if (local_1fa != OPERATING) {
      sendBrokerErrorAck(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                         in_stack_fffffffffffffac4);
      return;
    }
    bVar1 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>(local_c8,observer_flag);
    if ((!bVar1) && (((in_RDI->super_BrokerBase).dynamicFederation & 1U) == 0)) {
      sendBrokerErrorAck(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                         in_stack_fffffffffffffac4);
      return;
    }
  }
  bVar1 = verifyBrokerKey(in_stack_fffffffffffff988,
                          (ActionMessage *)
                          CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
  if (!bVar1) {
    sendBrokerErrorAck(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac4
                      );
    return;
  }
  bVar1 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                    (local_c8,test_connection_flag);
  if (!bVar1) {
    sVar12 = ActionMessage::name((ActionMessage *)0x5d9e47);
    pcVar16 = (char *)sVar12._M_len;
    local_3e0 = sVar12._M_str;
    local_400 = ActionMessage::name((ActionMessage *)0x5d9e64);
    gmlc::containers::
    DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>
    ::insert<std::basic_string_view<char,std::char_traits<char>>>
              (&in_RDI->mBrokers,pcVar16,local_3e0,&local_400);
    bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x5d9eb2);
    if (!bVar1) {
      sendBrokerErrorAck(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                         in_stack_fffffffffffffac4);
      return;
    }
    bVar1 = GlobalFederateId::isValid(&local_c8->source_id);
    if ((!bVar1) ||
       (bVar1 = GlobalFederateId::operator==(&local_c8->source_id,(GlobalBrokerId)0x0), bVar1)) {
      aVar13 = (action_t)((ulong)in_stack_fffffffffffff988 >> 0x20);
      in_RDI->routeCount = in_RDI->routeCount + 1;
      rVar3 = generateRouteId(in_stack_fffffffffffff970,in_stack_fffffffffffff96c);
      pBVar11 = gmlc::containers::
                DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                ::back((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                        *)0x5d9f67);
      (pBVar11->route).rid = rVar3.rid;
      pBVar11 = gmlc::containers::
                DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                ::back((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                        *)0x5d9f85);
      uVar2 = (pBVar11->route).rid;
      uVar4 = ActionMessage::getExtraData((ActionMessage *)0x5d9f9c);
      ActionMessage::getString_abi_cxx11_(in_stack_fffffffffffff978,in_stack_fffffffffffff974);
      in_stack_fffffffffffffbe0 =
           std::__cxx11::string::operator_cast_to_basic_string_view
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
      (*(in_RDI->super_Broker)._vptr_Broker[0x24])
                (in_RDI,(ulong)uVar2,(ulong)uVar4,in_stack_fffffffffffffbe0._M_len,
                 in_stack_fffffffffffffbe0._M_str);
      pBVar11 = gmlc::containers::
                DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                ::back((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                        *)0x5da00d);
      (pBVar11->parent).gid = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
      pBVar11 = gmlc::containers::
                DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                ::back((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                        *)0x5da027);
      pBVar11->_nonLocal = false;
      pBVar11 = gmlc::containers::
                DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                ::back((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                        *)0x5da03f);
      pBVar11->_route_key = true;
      bVar1 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>(local_c8,observer_flag)
      ;
      pBVar11 = gmlc::containers::
                DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                ::back((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                        *)0x5da06d);
      pBVar11->_observer = bVar1;
    }
    else {
      in_stack_fffffffffffffbd8 = (local_c8->source_id).gid;
      in_stack_fffffffffffffbdc = getRoute(in_stack_fffffffffffff988,in_stack_fffffffffffff990);
      aVar13 = (action_t)((ulong)in_stack_fffffffffffff988 >> 0x20);
      pBVar11 = gmlc::containers::
                DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                ::back((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                        *)0x5da0bd);
      (pBVar11->route).rid = in_stack_fffffffffffffbdc.rid;
      pBVar11 = gmlc::containers::
                DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                ::back((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                        *)0x5da0db);
      in_stack_fffffffffffffbd4 = 0;
      bVar1 = route_id::operator==(&pBVar11->route,(route_id)0x0);
      if (bVar1) {
        std::operator<<((ostream *)&std::cout," invalid route to parent broker or reg broker\n");
      }
      in_stack_fffffffffffffbd0 =
           GlobalFederateId::operator_cast_to_GlobalBrokerId
                     ((GlobalFederateId *)
                      CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
      pBVar11 = gmlc::containers::
                DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                ::back((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                        *)0x5da140);
      (pBVar11->parent).gid = in_stack_fffffffffffffbd0.gid;
      pBVar11 = gmlc::containers::
                DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                ::back((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                        *)0x5da15e);
      pBVar11->_nonLocal = true;
      bVar1 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>(local_c8,observer_flag)
      ;
      pBVar11 = gmlc::containers::
                DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                ::back((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                        *)0x5da18c);
      pBVar11->_observer = bVar1;
    }
    bVar1 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>(local_c8,core_flag);
    pBVar11 = gmlc::containers::
              DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
              ::back((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                      *)0x5da1c0);
    pBVar11->_core = bVar1;
    if (((in_RDI->super_BrokerBase).field_0x294 & 1) == 0) {
      bVar1 = GlobalBrokerId::isValid(&(in_RDI->super_BrokerBase).global_broker_id_local);
      if (bVar1) {
        local_434 = 0;
        bVar1 = GlobalBrokerId::operator!=
                          (&(in_RDI->super_BrokerBase).global_broker_id_local,(GlobalBrokerId)0x0);
        if (bVar1) {
          local_43c = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
          GlobalFederateId::GlobalFederateId(&local_438,(GlobalBrokerId)local_43c);
          (local_c8->source_id).gid = local_438.gid;
          local_440 = 0;
          (*(in_RDI->super_Broker)._vptr_Broker[0x22])(in_RDI,0,local_c8);
          return;
        }
      }
      gmlc::containers::SimpleQueue<helics::ActionMessage,std::mutex>::push<helics::ActionMessage&>
                (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
      return;
    }
    sVar10 = gmlc::containers::
             DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
             ::size((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                     *)0x5da2cb);
    GlobalBrokerId::GlobalBrokerId(&local_444,(int)sVar10 + 0x6fffffff);
    pBVar11 = gmlc::containers::
              DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
              ::back((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                      *)0x5da2f7);
    (pBVar11->global_id).gid = local_444.gid;
    gmlc::containers::
    DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
    ::back((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
            *)0x5da323);
    gmlc::containers::
    DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
    ::size((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
            *)0x5da340);
    gmlc::containers::
    DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
    ::addSearchTermForIndex
              ((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
               (size_t)in_stack_fffffffffffff998);
    pBVar11 = gmlc::containers::
              DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
              ::back((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                      *)0x5da36a);
    local_448.gid = (pBVar11->global_id).gid;
    pBVar11 = gmlc::containers::
              DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
              ::back((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                      *)0x5da388);
    local_44c.rid = (pBVar11->route).rid;
    bVar1 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                      (local_c8,slow_responding_flag);
    if (bVar1) {
      pBVar11 = gmlc::containers::
                DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                ::back((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                        *)0x5da3be);
      pBVar11->_disable_ping = true;
    }
    std::
    unordered_map<helics::GlobalFederateId,helics::route_id,std::hash<helics::GlobalFederateId>,std::equal_to<helics::GlobalFederateId>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>>
    ::emplace<helics::GlobalBrokerId&,helics::route_id&>
              ((unordered_map<helics::GlobalFederateId,_helics::route_id,_std::hash<helics::GlobalFederateId>,_std::equal_to<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>_>
                *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
               (GlobalBrokerId *)in_stack_fffffffffffff978,
               (route_id *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
    ActionMessage::ActionMessage
              ((ActionMessage *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990.gid),
               aVar13);
    id.gid = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
    GlobalFederateId::GlobalFederateId((GlobalFederateId *)&stack0xfffffffffffffae4,id);
    GVar15.gid = local_448.gid;
    GlobalFederateId::GlobalFederateId((GlobalFederateId *)&stack0xfffffffffffffadc,local_448);
    sVar12 = ActionMessage::name((ActionMessage *)0x5da478);
    auVar14 = sVar12._3_13_;
    name_00._M_len._4_4_ = in_stack_fffffffffffff96c;
    name_00._M_len._0_4_ = in_stack_fffffffffffff968;
    name_00._M_str._0_4_ = in_stack_fffffffffffff970;
    name_00._M_str._4_4_ = in_stack_fffffffffffff974;
    ActionMessage::name((ActionMessage *)0x5da4bb,name_00);
    if (((in_RDI->super_BrokerBase).no_ping & 1U) != 0) {
      setActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                ((ActionMessage *)local_518,slow_responding_flag);
    }
    if (((((in_RDI->super_BrokerBase).globalTime & 1U) != 0) ||
        (((in_RDI->super_BrokerBase).asyncTime & 1U) != 0)) &&
       (setActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                  ((ActionMessage *)local_518,global_timing_flag),
       ((in_RDI->super_BrokerBase).asyncTime & 1U) != 0)) {
      setActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                ((ActionMessage *)local_518,async_timing_flag);
    }
    if (((in_RDI->super_BrokerBase).globalDisconnect & 1U) != 0) {
      setActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                ((ActionMessage *)local_518,global_disconnect_flag);
    }
    (*(in_RDI->super_Broker)._vptr_Broker[0x22])(in_RDI,(ulong)(uint)local_44c.rid,local_518);
    _Var5 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)in_stack_fffffffffffff978);
    if (8 < _Var5) {
      local_544 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
      GlobalFederateId::GlobalFederateId(&local_540,(GlobalBrokerId)local_544);
      getIdentifier_abi_cxx11_(in_RDI);
      local_558 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
      local_598 = "registering broker {}({}) on route {}";
      local_590 = 0x25;
      local_5a8 = ActionMessage::name((ActionMessage *)0x5da65c);
      BVar6 = GlobalBrokerId::baseValue(&local_448);
      local_5ac = BVar6;
      local_5b0 = route_id::baseValue(&local_44c);
      local_38 = local_588;
      local_48 = local_598;
      uStack_40 = local_590;
      local_50 = &local_5a8;
      local_58 = &local_5ac;
      local_60 = &local_5b0;
      local_78 = local_598;
      uStack_70 = local_590;
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                ((value<fmt::v11::context> *)CONCAT44(BVar6,local_5b0),
                 (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff978);
      local_18 = local_a8;
      local_1c = *local_58;
      local_28 = local_98;
      local_2c = *local_60;
      local_8 = &local_88;
      local_10 = local_b8;
      local_88 = 0x11d;
      args.desc_._4_4_ = in_stack_fffffffffffffbd4;
      args.desc_._0_4_ = in_stack_fffffffffffffbd0.gid;
      args.field_1._0_4_ = in_stack_fffffffffffffbd8;
      args.field_1._4_4_ = in_stack_fffffffffffffbdc.rid;
      local_a8[0] = local_1c;
      local_98[0] = local_2c;
      local_80 = local_10;
      ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_fffffffffffffbe0,args);
      local_568 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
      in_stack_fffffffffffff970 = (int32_t)local_568._M_str;
      in_stack_fffffffffffff974 = local_568._M_str._4_4_;
      name_01._M_len._4_4_ = in_stack_fffffffffffffadc.gid;
      name_01._M_len._0_4_ = GVar15.gid;
      name_01._M_str._0_4_ = id.gid;
      name_01._M_str._4_4_ = in_stack_fffffffffffffae4.gid;
      message._M_str = pcVar16;
      message._M_len = in_stack_fffffffffffffc10;
      BrokerBase::sendToLogger
                (auVar14._5_8_,in_stack_fffffffffffffaec,auVar14._1_4_,name_01,message,auVar14[0]);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
    }
    ActionMessage::~ActionMessage
              ((ActionMessage *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
    return;
  }
  route_id::route_id(&local_2c8);
  local_2c9 = 0;
  bVar1 = GlobalFederateId::isValid(&local_c8->source_id);
  if (bVar1) {
    local_2d0 = 0;
    bVar1 = GlobalFederateId::operator==(&local_c8->source_id,(GlobalBrokerId)0x0);
    if (!bVar1) {
      local_2f0 = (local_c8->source_id).gid;
      local_2ec = (BaseType)getRoute(in_stack_fffffffffffff988,in_stack_fffffffffffff990);
      aVar13 = (action_t)((ulong)in_stack_fffffffffffff988 >> 0x20);
      local_2c8 = (route_id)local_2ec;
      goto LAB_005d9cac;
    }
  }
  aVar13 = (action_t)((ulong)in_stack_fffffffffffff988 >> 0x20);
  in_RDI->routeCount = in_RDI->routeCount + 1;
  local_2d8 = (uint)generateRouteId(in_stack_fffffffffffff970,in_stack_fffffffffffff96c);
  local_2d4 = local_2d8;
  local_2c8 = (route_id)local_2d8;
  uVar2 = ActionMessage::getExtraData((ActionMessage *)0x5d9c04);
  ActionMessage::getString_abi_cxx11_(in_stack_fffffffffffff978,in_stack_fffffffffffff974);
  local_2e8 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
  (*(in_RDI->super_Broker)._vptr_Broker[0x24])
            (in_RDI,(ulong)local_2d8,(ulong)uVar2,local_2e8._M_len,local_2e8._M_str);
  local_2c9 = 1;
LAB_005d9cac:
  ActionMessage::ActionMessage
            ((ActionMessage *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990.gid),
             aVar13);
  setActionFlag<helics::ActionMessage,helics::GeneralFlags>(&local_3a8,error_flag);
  setActionFlag<helics::ActionMessage,helics::ConnectionFlags>(&local_3a8,test_connection_flag);
  GlobalFederateId::GlobalFederateId
            (&local_3ac,(GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
  local_3a8.source_id.gid = local_3ac.gid;
  ActionMessage::name((ActionMessage *)0x5d9d2f);
  name._M_len._4_4_ = in_stack_fffffffffffff96c;
  name._M_len._0_4_ = in_stack_fffffffffffff968;
  name._M_str._0_4_ = in_stack_fffffffffffff970;
  name._M_str._4_4_ = in_stack_fffffffffffff974;
  ActionMessage::name((ActionMessage *)0x5d9d78,name);
  local_3a8.messageID = 0x133;
  (*(in_RDI->super_Broker)._vptr_Broker[0x22])(in_RDI,(ulong)(uint)local_2c8.rid,&local_3a8);
  if ((local_2c9 & 1) != 0) {
    (*(in_RDI->super_Broker)._vptr_Broker[0x25])(in_RDI,(ulong)(uint)local_2c8.rid);
  }
  ActionMessage::~ActionMessage
            ((ActionMessage *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
  return;
}

Assistant:

void CoreBroker::brokerRegistration(ActionMessage&& command)
{
    if (!connectionEstablished) {
        earlyMessages.push_back(std::move(command));
        return;
    }
    const bool jsonReply = checkActionFlag(command, use_json_serialization_flag);
    if (command.counter > 0) {  // this indicates it is a resend
        auto brk = mBrokers.find(command.name());
        if (brk != mBrokers.end()) {
            // we would get this if the ack didn't go through for some reason
            brk->route = generateRouteId(jsonReply ? json_route_code : 0, routeCount++);
            addRoute(brk->route, command.getExtraData(), command.getString(targetStringLoc));
            routing_table[brk->global_id] = brk->route;

            // sending the response message
            ActionMessage brokerReply(CMD_BROKER_ACK);
            brokerReply.source_id = global_broker_id_local;  // source is global root
            brokerReply.dest_id = brk->global_id;  // the new id
            brokerReply.name(command.name());  // the identifier of the broker
            if (no_ping) {
                setActionFlag(brokerReply, slow_responding_flag);
            }
            if (globalTime || asyncTime) {
                setActionFlag(brokerReply, global_timing_flag);
                if (asyncTime) {
                    setActionFlag(brokerReply, async_timing_flag);
                }
            }
            transmit(brk->route, brokerReply);
            return;
        }
    }
    // check the max broker count
    if (static_cast<decltype(maxBrokerCount)>(mBrokers.size()) >= maxBrokerCount) {
        sendBrokerErrorAck(command, max_broker_count_exceeded);
        return;
    }

    auto currentBrokerState = getBrokerState();
    if (currentBrokerState < BrokerState::OPERATING) {
        if (allInitReady()) {
            // send an init not ready as we were ready now we are not
            ActionMessage noInit(CMD_INIT_NOT_READY);
            noInit.source_id = global_broker_id_local;
            transmit(parent_route_id, noInit);
        }
    } else if (currentBrokerState == BrokerState::OPERATING) {
        // we are initialized already
        if (!checkActionFlag(command, observer_flag) && !dynamicFederation) {
            sendBrokerErrorAck(command, already_init_error_code);
            return;
        }
        // can't add a non observer federate in OPERATING mode unless this is a dynamicFederation
    } else {
        sendBrokerErrorAck(command, broker_terminating);
        return;
    }
    if (!verifyBrokerKey(command)) {
        sendBrokerErrorAck(command, mismatch_broker_key_error_code);
        return;
    }
    if (checkActionFlag(command, test_connection_flag)) {
        route_id newroute;
        bool route_created = false;
        if ((!command.source_id.isValid()) || (command.source_id == parent_broker_id)) {
            newroute = generateRouteId(jsonReply ? json_route_code : 0, routeCount++);
            addRoute(newroute, command.getExtraData(), command.getString(targetStringLoc));
            route_created = true;
        } else {
            newroute = getRoute(command.source_id);
        }
        ActionMessage testInit(CMD_BROKER_ACK);
        setActionFlag(testInit, error_flag);
        setActionFlag(testInit, test_connection_flag);
        testInit.source_id = global_broker_id_local;
        testInit.name(command.name());
        testInit.messageID = CONNECTION_TEST;
        transmit(newroute, testInit);

        if (route_created) {
            removeRoute(newroute);
        }
        // this was a test connection and should not be added
        return;
    }
    auto inserted = mBrokers.insert(command.name(), no_search, command.name());
    if (!inserted) {
        sendBrokerErrorAck(command, duplicate_broker_name_error_code);
        return;
    }
    if ((!command.source_id.isValid()) || (command.source_id == parent_broker_id)) {
        // TODO(PT): this will need to be updated when we enable mesh routing
        mBrokers.back().route = generateRouteId(jsonReply ? json_route_code : 0, routeCount++);
        addRoute(mBrokers.back().route, command.getExtraData(), command.getString(targetStringLoc));
        mBrokers.back().parent = global_broker_id_local;
        mBrokers.back()._nonLocal = false;
        mBrokers.back()._route_key = true;
        mBrokers.back()._observer = checkActionFlag(command, observer_flag);
    } else {
        mBrokers.back().route = getRoute(command.source_id);
        if (mBrokers.back().route == parent_route_id) {
            std::cout << " invalid route to parent broker or reg broker\n";
        }
        mBrokers.back().parent = command.source_id;
        mBrokers.back()._nonLocal = true;
        mBrokers.back()._observer = checkActionFlag(command, observer_flag);
    }
    mBrokers.back()._core = checkActionFlag(command, core_flag);
    if (!isRootc) {
        if ((global_broker_id_local.isValid()) && (global_broker_id_local != parent_broker_id)) {
            command.source_id = global_broker_id_local;
            transmit(parent_route_id, command);
        } else {
            // delay the response if we are not fully registered yet
            delayTransmitQueue.push(command);
        }
    } else {
        mBrokers.back().global_id = GlobalBrokerId(
            static_cast<GlobalBrokerId::BaseType>(mBrokers.size()) - 1 + gGlobalBrokerIdShift);
        mBrokers.addSearchTermForIndex(mBrokers.back().global_id, mBrokers.size() - 1);
        auto global_brkid = mBrokers.back().global_id;
        auto route = mBrokers.back().route;
        if (checkActionFlag(command, slow_responding_flag)) {
            mBrokers.back()._disable_ping = true;
        }
        routing_table.emplace(global_brkid, route);

        // sending the response message
        ActionMessage brokerReply(CMD_BROKER_ACK);
        brokerReply.source_id = global_broker_id_local;  // source is global root
        brokerReply.dest_id = global_brkid;  // the new id
        brokerReply.name(command.name());  // the identifier of the broker
        if (no_ping) {
            setActionFlag(brokerReply, slow_responding_flag);
        }
        if (globalTime || asyncTime) {
            setActionFlag(brokerReply, global_timing_flag);
            if (asyncTime) {
                setActionFlag(brokerReply, async_timing_flag);
            }
        }
        if (globalDisconnect) {
            setActionFlag(brokerReply, global_disconnect_flag);
        }
        transmit(route, brokerReply);
        LOG_CONNECTIONS(global_broker_id_local,
                        getIdentifier(),
                        fmt::format("registering broker {}({}) on route {}",
                                    command.name(),
                                    global_brkid.baseValue(),
                                    route.baseValue()));
    }
}